

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_blend.cpp
# Opt level: O2

void V_AddPlayerBlend(player_t *CPlayer,float *blend,float maxinvalpha,int maxpainblend)

{
  uint uVar1;
  PalEntry PVar2;
  int iVar3;
  int iVar4;
  APlayerPawn *this;
  PClassPlayerPawn *this_00;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  PalEntry painFlash;
  FName local_2c;
  
  this = CPlayer->mo;
  while (this = (APlayerPawn *)
                GC::ReadBarrier<AInventory>((AInventory **)&(this->super_AActor).Inventory),
        this != (APlayerPawn *)0x0) {
    PVar2 = AInventory::CallGetBlend((AInventory *)this);
    if (0xffffff < (uint)PVar2.field_0) {
      fVar7 = (float)((uint)PVar2.field_0 >> 0x18) / 255.0;
      V_AddBlend((float)((uint)PVar2.field_0 >> 0x10 & 0xff) / 255.0,
                 (float)((uint)PVar2.field_0 >> 8 & 0xff) / 255.0,
                 (float)((uint)PVar2.field_0 & 0xff) / 255.0,fVar7,blend);
      if (maxinvalpha < fVar7) {
        maxinvalpha = fVar7;
      }
    }
  }
  if (CPlayer->bonuscount != 0) {
    fVar7 = (float)(CPlayer->bonuscount << 3) * pickup_fade_scalar.Value;
    if ((int)fVar7 < 0x81) {
      fVar7 = (float)(int)fVar7 / 255.0;
    }
    else {
      fVar7 = 0.5;
    }
    V_AddBlend((float)(gameinfo.pickupcolor >> 0x10 & 0xff) / 255.0,
               (float)(gameinfo.pickupcolor >> 8 & 0xff) / 255.0,
               (float)(gameinfo.pickupcolor & 0xff) / 255.0,fVar7,blend);
  }
  painFlash.field_0 =
       (anon_union_4_2_12391d7c_for_PalEntry_0)
       *(anon_union_4_2_12391d7c_for_PalEntry_0 *)&(CPlayer->mo->DamageFade).field_0.field_0;
  this_00 = (PClassPlayerPawn *)DObject::GetClass((DObject *)CPlayer->mo);
  local_2c.Index = (CPlayer->mo->super_AActor).DamageTypeReceived.super_FName.Index;
  PClassPlayerPawn::GetPainFlash(this_00,&local_2c,&painFlash);
  if (painFlash.field_0.field_0.a != '\0') {
    iVar3 = (int)((uint)painFlash.field_0.field_0.a * CPlayer->damagecount) / 0xff;
    iVar4 = 0x71;
    if (iVar3 < 0x71) {
      iVar4 = iVar3;
    }
    iVar4 = (int)((float)""[iVar4] * blood_fade_scalar.Value);
    if (iVar4 != 0) {
      if (iVar4 < maxpainblend) {
        maxpainblend = iVar4;
      }
      V_AddBlend((float)((uint)painFlash.field_0 >> 0x10 & 0xff) / 255.0,
                 (float)((uint)painFlash.field_0 >> 8 & 0xff) / 255.0,
                 (float)((uint)painFlash.field_0 & 0xff) / 255.0,(float)maxpainblend / 255.0,blend);
    }
  }
  iVar4 = CPlayer->poisoncount;
  if (iVar4 != 0) {
    if (0x3f < iVar4) {
      iVar4 = 0x40;
    }
    if (((byte)paletteflash.Value & 2) == 0) {
      fVar8 = (float)iVar4 / 93.25714;
      fVar7 = 0.04;
      fVar5 = 0.2571;
      fVar6 = 0.0;
    }
    else {
      fVar8 = (float)(iVar4 + 7 >> 3) * 0.1;
      fVar7 = 0.17254902;
      fVar5 = 0.36078432;
      fVar6 = 0.14117648;
    }
    V_AddBlend(fVar7,fVar5,fVar6,fVar8,blend);
  }
  uVar1 = CPlayer->hazardcount;
  if (uVar1 != 0) {
    if (((byte)paletteflash.Value & 8) == 0) {
      iVar4 = 0x40;
      if ((int)uVar1 / 8 < 0x40) {
        iVar4 = (int)uVar1 / 8;
      }
      fVar5 = (float)iVar4 / 93.25714;
      fVar7 = 0.2571;
    }
    else {
      if ((int)uVar1 < 0x231 && (uVar1 & 8) == 0) goto LAB_00484130;
      fVar7 = 1.0;
      fVar5 = 0.125;
    }
    V_AddBlend(0.0,fVar7,0.0,fVar5,blend);
  }
LAB_00484130:
  if ((CPlayer->mo->super_AActor).DamageType.super_FName.Index == 0x33) {
    if (((byte)paletteflash.Value & 4) == 0) {
      fVar7 = 0.25;
      fVar6 = 0.853;
      fVar8 = 0.4;
      fVar5 = 0.25;
    }
    else {
      fVar6 = 0.8784314;
      fVar8 = 0.5;
      fVar7 = 0.0;
      fVar5 = 0.0;
    }
    V_AddBlend(fVar7,fVar5,fVar6,fVar8,blend);
  }
  if (maxinvalpha < blend[3]) {
    blend[3] = maxinvalpha;
  }
  return;
}

Assistant:

void V_AddPlayerBlend (player_t *CPlayer, float blend[4], float maxinvalpha, int maxpainblend)
{
	int cnt;

	// [RH] All powerups can affect the screen blending now
	for (AInventory *item = CPlayer->mo->Inventory; item != NULL; item = item->Inventory)
	{
		PalEntry color = item->CallGetBlend ();
		if (color.a != 0)
		{
			V_AddBlend (color.r/255.f, color.g/255.f, color.b/255.f, color.a/255.f, blend);
			if (color.a/255.f > maxinvalpha) maxinvalpha = color.a/255.f;
		}
	}
	if (CPlayer->bonuscount)
	{
		cnt = CPlayer->bonuscount << 3;

		// [SP] Allow player to tone down intensity of pickup flash.
		cnt = (int)( cnt * pickup_fade_scalar );
		
		V_AddBlend (RPART(gameinfo.pickupcolor)/255.f, GPART(gameinfo.pickupcolor)/255.f, 
					BPART(gameinfo.pickupcolor)/255.f, cnt > 128 ? 0.5f : cnt / 255.f, blend);
	}

	PalEntry painFlash = CPlayer->mo->DamageFade;
	CPlayer->mo->GetClass()->GetPainFlash(CPlayer->mo->DamageTypeReceived, &painFlash);

	if (painFlash.a != 0)
	{
		cnt = DamageToAlpha[MIN (113, CPlayer->damagecount * painFlash.a / 255)];

		// [BC] Allow users to tone down the intensity of the blood on the screen.
		cnt = (int)( cnt * blood_fade_scalar );

		if (cnt)
		{
			if (cnt > maxpainblend)
				cnt = maxpainblend;

			V_AddBlend (painFlash.r / 255.f, painFlash.g / 255.f, painFlash.b / 255.f, cnt / 255.f, blend);
		}
	}

	// Unlike Doom, I did not have any utility source to look at to find the
	// exact numbers to use here, so I've had to guess by looking at how they
	// affect the white color in Hexen's palette and picking an alpha value
	// that seems reasonable.
	// [Gez] The exact values could be obtained by looking how they affect
	// each color channel in Hexen's palette.

	if (CPlayer->poisoncount)
	{
		cnt = MIN (CPlayer->poisoncount, 64);
		if (paletteflash & PF_POISON)
		{
			V_AddBlend(44/255.f, 92/255.f, 36/255.f, ((cnt + 7) >> 3) * 0.1f, blend);
		}
		else
		{
			V_AddBlend (0.04f, 0.2571f, 0.f, cnt/93.2571428571f, blend);
		}

	}

	if (CPlayer->hazardcount)
	{
		if (paletteflash & PF_HAZARD)
		{
			if (CPlayer->hazardcount > 16*TICRATE || (CPlayer->hazardcount & 8))
			{
				V_AddBlend (0.f, 1.f, 0.f, 0.125f, blend);
			}
		}
		else
		{
			cnt= MIN(CPlayer->hazardcount/8, 64);
			V_AddBlend (0.f, 0.2571f, 0.f, cnt/93.2571428571f, blend);
		}
	}

	if (CPlayer->mo->DamageType == NAME_Ice)
	{
		if (paletteflash & PF_ICE)
		{
			V_AddBlend(0.f, 0.f, 224/255.f, 0.5f, blend);
		}
		else
		{
			V_AddBlend (0.25f, 0.25f, 0.853f, 0.4f, blend);
		}		
	}

	// cap opacity if desired
	if (blend[3] > maxinvalpha) blend[3] = maxinvalpha;
}